

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetPropertyInternal(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  JSShape *sh_00;
  long *plVar1;
  JSValue val_00;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue v_13;
  JSValue v_14;
  JSValue v_15;
  JSValue v_16;
  JSValue v_17;
  JSValue new_val;
  JSValue val_01;
  JSValue prop_00;
  JSValue val_02;
  JSValue this_obj_00;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue val_06;
  JSValue v_18;
  JSValue v_19;
  JSValue v_20;
  JSValue getter;
  JSValue v_21;
  JSValue setter_00;
  JSValue val_07;
  JSValue val_08;
  JSValue this_obj_04;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  uint32_t uVar8;
  JSShapeProperty *pJVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSObject *in_R8;
  JSValueUnion in_R9;
  JSValue JVar12;
  uint in_stack_00000008;
  uint32_t idx_1;
  JSObject *setter;
  undefined1 in_stack_000000b0 [16];
  undefined1 in_stack_000000c0 [16];
  int in_stack_000000d0;
  JSValue obj1;
  JSClassExoticMethods *em;
  uint32_t idx;
  int ret;
  JSPropertyDescriptor desc;
  uint32_t tag;
  JSProperty *pr;
  JSShapeProperty *prs;
  JSObject *p1;
  JSObject *p;
  intptr_t h_1;
  JSShapeProperty *prop_2;
  JSShapeProperty *pr_2;
  JSShape *sh_1;
  intptr_t h;
  JSShapeProperty *prop_1;
  JSShapeProperty *pr_1;
  JSShape *sh;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  JSAtom in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  undefined4 uVar13;
  undefined4 uVar14;
  int in_stack_fffffffffffffd88;
  undefined4 uVar15;
  JSAtom in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 uVar16;
  JSAtom in_stack_fffffffffffffd94;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  JSContext *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  JSShapeProperty *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined8 in_stack_fffffffffffffdc8;
  JSAtom name;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  JSContext *in_stack_fffffffffffffdd8;
  JSObject *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  JSObject *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  JSValueUnion in_stack_fffffffffffffe00;
  int64_t in_stack_fffffffffffffe08;
  JSValueUnion in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  JSValue local_1e0;
  int64_t iStack_1d8;
  JSValueUnion local_1c0;
  JSValueUnion local_198;
  int64_t local_190;
  int in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  JSValue in_stack_fffffffffffffe90;
  JSValue in_stack_fffffffffffffea0;
  uint local_138 [10];
  JSValueUnion local_110;
  int64_t local_108;
  int local_fc;
  JSProperty *local_f8;
  JSValueUnion local_f0;
  JSValueUnion local_e8;
  JSValueUnion local_e0;
  uint local_d4;
  int local_a8;
  ulong in_stack_ffffffffffffff78;
  JSAtom prop_01;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  JSShape *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  JSValueUnion in_stack_ffffffffffffffa0;
  JSValueUnion local_50;
  ulong local_48;
  JSShapeProperty *local_10;
  
  iVar5 = (int)in_RDX;
  local_fc = iVar5;
  local_e0 = in_RSI;
  local_d4 = in_ECX;
  if (iVar5 == -1) {
    do {
      uVar2 = local_d4;
      sh_00 = *(JSShape **)((long)local_e0.ptr + 0x18);
      uVar3 = local_d4 & sh_00->prop_hash_mask;
      puVar11 = prop_hash_end(sh_00);
      uVar3 = puVar11[-1 - (ulong)uVar3];
      pJVar9 = get_shape_prop(sh_00);
      while (local_48 = (ulong)uVar3, local_48 != 0) {
        local_10 = pJVar9 + (local_48 - 1);
        if (local_10->atom == uVar2) goto LAB_0012bf89;
        uVar3 = *(uint *)local_10 & 0x3ffffff;
      }
      local_10 = (JSShapeProperty *)0x0;
LAB_0012bf89:
      local_f0.ptr = local_10;
      if (local_10 == (JSShapeProperty *)0x0) {
        local_e8.float64 = local_e0.float64;
        goto LAB_0012c1aa;
      }
      if ((*(uint *)local_10 >> 0x1a & 0x3a) == 2) {
        JVar12.u._4_4_ = in_stack_fffffffffffffd9c;
        JVar12.u.int32 = in_stack_fffffffffffffd98;
        JVar12.tag = (int64_t)in_stack_fffffffffffffda0;
        set_value((JSContext *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                  (JSValue *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),JVar12);
        return 1;
      }
      if ((*(uint *)local_10 >> 0x1a & 8) != 0) {
        val_05.tag = in_stack_fffffffffffffe08;
        val_05.u.ptr = in_stack_fffffffffffffe00.ptr;
        iVar5 = set_array_length((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                 in_stack_fffffffffffffdf0,val_05,in_stack_fffffffffffffdec);
        return iVar5;
      }
      if ((*(uint *)local_10 >> 0x1a & 0x30) == 0x10) {
        this_obj_01.tag = in_stack_fffffffffffffe08;
        this_obj_01.u.ptr = in_stack_fffffffffffffe00.ptr;
        val_02.tag._0_4_ = in_stack_fffffffffffffdf8;
        val_02.u.ptr = in_stack_fffffffffffffdf0;
        val_02.tag._4_4_ = in_stack_fffffffffffffdfc;
        iVar5 = call_setter((JSContext *)
                            CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                            in_stack_fffffffffffffde0,this_obj_01,val_02,iVar4);
        return iVar5;
      }
      if ((*(uint *)local_10 >> 0x1a & 0x30) == 0x20) {
        if (*(short *)((long)local_e0.ptr + 6) != 0xb) {
          new_val.u._4_4_ = in_stack_fffffffffffffd9c;
          new_val.u.int32 = in_stack_fffffffffffffd98;
          new_val.tag = (int64_t)in_stack_fffffffffffffda0;
          set_value((JSContext *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    (JSValue *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),new_val
                   );
          return 1;
        }
        goto LAB_0012cb84;
      }
      if ((*(uint *)local_10 >> 0x1a & 0x30) != 0x30) goto LAB_0012cb84;
      iVar6 = JS_AutoInitProperty(in_stack_fffffffffffffdd8,
                                  (JSObject *)
                                  CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                  (JSAtom)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                                  (JSProperty *)
                                  CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                  in_stack_fffffffffffffdb8);
    } while (iVar6 == 0);
    v_01.u._4_4_ = in_stack_fffffffffffffd8c;
    v_01.u.int32 = in_stack_fffffffffffffd88;
    v_01.tag._0_4_ = in_stack_fffffffffffffd90;
    v_01.tag._4_4_ = in_stack_fffffffffffffd94;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_01);
    local_a8 = -1;
  }
  else if (iVar5 == 2) {
    v.u._4_4_ = in_stack_fffffffffffffd8c;
    v.u.int32 = in_stack_fffffffffffffd88;
    v.tag._0_4_ = in_stack_fffffffffffffd90;
    v.tag._4_4_ = in_stack_fffffffffffffd94;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v);
    __JS_ThrowTypeErrorAtom
              ((JSContext *)in_RDI.ptr,(JSAtom)(ulong)local_d4,"cannot set property \'%s\' of null",
               "");
    local_a8 = -1;
  }
  else if (iVar5 == 3) {
    v_00.u._4_4_ = in_stack_fffffffffffffd8c;
    v_00.u.int32 = in_stack_fffffffffffffd88;
    v_00.tag._0_4_ = in_stack_fffffffffffffd90;
    v_00.tag._4_4_ = in_stack_fffffffffffffd94;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_00);
    __JS_ThrowTypeErrorAtom
              ((JSContext *)in_RDI.ptr,(JSAtom)(ulong)local_d4,
               "cannot set property \'%s\' of undefined","");
    local_a8 = -1;
  }
  else {
    local_e0.float64 = 0.0;
    val_07.tag = in_RDX;
    val_07.u.ptr = in_RSI.ptr;
    in_stack_fffffffffffffdac = iVar5;
    in_stack_fffffffffffffe90 = JS_GetPrototypePrimitive((JSContext *)in_RDI.ptr,val_07);
    local_e8 = in_stack_fffffffffffffe90.u;
LAB_0012c921:
    name = (JSAtom)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    if (local_e8.ptr != (void *)0x0) {
      do {
        in_stack_ffffffffffffff90 = *(JSShape **)((long)local_e8.ptr + 0x18);
        uVar10 = (ulong)(local_d4 & in_stack_ffffffffffffff90->prop_hash_mask);
        in_stack_ffffffffffffff9c = local_d4;
        in_stack_ffffffffffffffa0 = local_e8;
        puVar11 = prop_hash_end(in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff78 = (ulong)puVar11[-1 - uVar10];
        in_stack_ffffffffffffff80 = (JSContext *)get_shape_prop(in_stack_ffffffffffffff90);
        while (in_stack_ffffffffffffff78 != 0) {
          in_stack_ffffffffffffff88.ptr =
               (void *)((long)in_stack_ffffffffffffff80 + (in_stack_ffffffffffffff78 - 1) * 8);
          local_50.ptr = in_stack_ffffffffffffff88.ptr;
          if (*(uint *)((long)in_stack_ffffffffffffff88.ptr + 4) == in_stack_ffffffffffffff9c)
          goto LAB_0012ca8f;
          in_stack_ffffffffffffff78 = (ulong)(*in_stack_ffffffffffffff88.ptr & 0x3ffffff);
        }
        local_50.float64 = 0.0;
LAB_0012ca8f:
        local_f0.float64 = local_50.float64;
        if ((uint *)local_50.ptr == (uint *)0x0) goto LAB_0012c1aa;
        if ((*local_50.ptr >> 0x1a & 0x30) == 0x10) {
          this_obj_03.tag = in_stack_fffffffffffffe08;
          this_obj_03.u.float64 = in_stack_fffffffffffffe00.float64;
          val_04.tag._0_4_ = in_stack_fffffffffffffdf8;
          val_04.u.ptr = in_stack_fffffffffffffdf0;
          val_04.tag._4_4_ = in_stack_fffffffffffffdfc;
          iVar5 = call_setter((JSContext *)
                              CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                              in_stack_fffffffffffffde0,this_obj_03,val_04,iVar4);
          return iVar5;
        }
        if ((*local_50.ptr >> 0x1a & 0x30) != 0x30) goto LAB_0012cb6d;
        iVar6 = JS_AutoInitProperty(in_stack_fffffffffffffdd8,
                                    (JSObject *)
                                    CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                    (JSAtom)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                                    (JSProperty *)
                                    CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                    in_stack_fffffffffffffdb8);
        if (iVar6 != 0) {
          return -1;
        }
      } while( true );
    }
LAB_0012cbd3:
    if ((in_stack_00000008 & 0x10000) == 0) {
      if (local_e0.ptr == (void *)0x0) {
        v_14.u._4_4_ = in_stack_fffffffffffffd8c;
        v_14.u.int32 = in_stack_fffffffffffffd88;
        v_14.tag._0_4_ = in_stack_fffffffffffffd90;
        v_14.tag._4_4_ = in_stack_fffffffffffffd94;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_14
                    );
        local_a8 = JS_ThrowTypeErrorOrFalse
                             ((JSContext *)in_RDI.ptr,(int)(ulong)in_stack_00000008,"not an object")
        ;
      }
      else if ((*(byte *)((long)local_e0.ptr + 5) & 1) == 0) {
        v_15.u._4_4_ = in_stack_fffffffffffffd8c;
        v_15.u.int32 = in_stack_fffffffffffffd88;
        v_15.tag._0_4_ = in_stack_fffffffffffffd90;
        v_15.tag._4_4_ = in_stack_fffffffffffffd94;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_15
                    );
        local_a8 = JS_ThrowTypeErrorOrFalse
                             ((JSContext *)in_RDI.ptr,(int)(ulong)in_stack_00000008,
                              "object is not extensible");
      }
      else if ((*(byte *)((long)local_e0.ptr + 5) >> 2 & 1) == 0) {
        local_f8 = add_property((JSContext *)
                                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                                (JSObject *)
                                CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
        if (local_f8 == (JSProperty *)0x0) {
          v_17.u._4_4_ = in_stack_fffffffffffffd8c;
          v_17.u.int32 = in_stack_fffffffffffffd88;
          v_17.tag._0_4_ = in_stack_fffffffffffffd90;
          v_17.tag._4_4_ = in_stack_fffffffffffffd94;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       v_17);
          local_a8 = -1;
        }
        else {
          (local_f8->u).getset.getter = in_R8;
          (local_f8->u).value.tag = (int64_t)in_R9;
          local_a8 = 1;
        }
      }
      else if (((*(short *)((long)local_e0.ptr + 6) == 2) &&
               ((*(byte *)((long)local_e0.ptr + 5) >> 3 & 1) != 0)) &&
              ((BVar7 = __JS_AtomIsTaggedInt(local_d4), BVar7 != 0 &&
               (uVar8 = __JS_AtomToUInt32(local_d4),
               uVar8 == *(uint32_t *)((long)local_e0.ptr + 0x40))))) {
        val_01.u._4_4_ = in_stack_fffffffffffffdac;
        val_01.u.int32 = in_stack_fffffffffffffda8;
        val_01.tag._0_4_ = in_stack_fffffffffffffdb0;
        val_01.tag._4_4_ = in_stack_fffffffffffffdb4;
        local_a8 = add_fast_array_element
                             (in_stack_fffffffffffffda0,
                              (JSObject *)
                              CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),val_01,
                              in_stack_fffffffffffffd94);
      }
      else {
        uVar13 = 3;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 3;
        uVar17 = 0;
        getter.tag = (int64_t)in_R8;
        getter.u.ptr = in_RDI.ptr;
        setter_00.tag = (int64_t)in_RSI.ptr;
        setter_00.u.float64 = in_R9.float64;
        local_a8 = JS_CreateProperty((JSContext *)in_stack_fffffffffffffe90.tag,
                                     (JSObject *)in_stack_fffffffffffffe90.u.ptr,
                                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffea0,getter,
                                     setter_00,in_stack_fffffffffffffe88);
        v_16.u._4_4_ = in_stack_fffffffffffffdb4;
        v_16.u.int32 = uVar15;
        v_16.tag._0_4_ = uVar16;
        v_16.tag._4_4_ = uVar17;
        JS_FreeValue((JSContext *)CONCAT44(uVar14,uVar13),v_16);
      }
    }
    else {
      v_13.u._4_4_ = in_stack_fffffffffffffd8c;
      v_13.u.int32 = in_stack_fffffffffffffd88;
      v_13.tag._0_4_ = in_stack_fffffffffffffd90;
      v_13.tag._4_4_ = in_stack_fffffffffffffd94;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_13);
      JS_ThrowReferenceErrorNotDefined
                ((JSContext *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),name);
      local_a8 = -1;
    }
  }
  return local_a8;
LAB_0012cb6d:
  if ((*local_50.ptr >> 0x1a & 2) == 0) goto LAB_0012cb84;
LAB_0012c1aa:
  prop_01 = (JSAtom)(in_stack_ffffffffffffff78 >> 0x20);
  if ((*(byte *)((long)local_e8.ptr + 5) >> 2 & 1) != 0) {
    if ((*(byte *)((long)local_e8.ptr + 5) >> 3 & 1) == 0) {
      plVar1 = *(long **)(*(long *)(*(long *)((long)in_RDI.ptr + 0x18) + 0x70) +
                          (ulong)*(ushort *)((long)local_e8.ptr + 6) * 0x28 + 0x20);
      if (plVar1 != (long *)0x0) {
        if (plVar1[6] != 0) {
          v_19.tag = -1;
          v_19.u.ptr = local_e8.ptr;
          JVar12 = JS_DupValue((JSContext *)in_RDI.ptr,v_19);
          local_1c0 = JVar12.u;
          uVar13 = (undefined4)((ulong)in_RDX >> 0x20);
          iVar4 = (*(code *)plVar1[6])
                            (in_RDI.float64,local_1c0.float64,JVar12.tag,local_d4,in_R8,
                             in_R9.float64,in_RSI.int32);
          v_04.u._4_4_ = in_stack_fffffffffffffd8c;
          v_04.u.int32 = in_stack_00000008;
          v_04.tag._0_4_ = in_stack_fffffffffffffd90;
          v_04.tag._4_4_ = in_stack_fffffffffffffd94;
          JS_FreeValue((JSContext *)CONCAT44(uVar13,iVar5),v_04);
          v_05.u._4_4_ = in_stack_fffffffffffffd8c;
          v_05.u.int32 = in_stack_00000008;
          v_05.tag._0_4_ = in_stack_fffffffffffffd90;
          v_05.tag._4_4_ = in_stack_fffffffffffffd94;
          JS_FreeValue((JSContext *)CONCAT44(uVar13,iVar5),v_05);
          return iVar4;
        }
        if (*plVar1 != 0) {
          in_stack_fffffffffffffe18 = -1;
          v_18.tag = -1;
          v_18.u.ptr = local_e8.ptr;
          in_stack_fffffffffffffe10 = local_e8;
          local_1e0 = JS_DupValue((JSContext *)in_RDI.ptr,v_18);
          iVar6 = (*(code *)*plVar1)(in_RDI.float64,local_138,local_1e0.u.float64,iStack_1d8,
                                     local_d4);
          v_06.u._4_4_ = in_stack_fffffffffffffd8c;
          v_06.u.int32 = in_stack_fffffffffffffd88;
          v_06.tag._0_4_ = in_stack_fffffffffffffd90;
          v_06.tag._4_4_ = in_stack_fffffffffffffd94;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       v_06);
          name = (JSAtom)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
          if (iVar6 < 0) {
            v_07.u._4_4_ = in_stack_fffffffffffffd8c;
            v_07.u.int32 = in_stack_fffffffffffffd88;
            v_07.tag._0_4_ = in_stack_fffffffffffffd90;
            v_07.tag._4_4_ = in_stack_fffffffffffffd94;
            JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         v_07);
            return iVar6;
          }
          if (iVar6 != 0) {
            if ((local_138[0] & 0x10) != 0) {
              v_20.tag = local_108;
              v_20.u.ptr = local_110.ptr;
              iVar5 = JS_IsUndefined(v_20);
              if (iVar5 != 0) {
                local_110.float64 = 0.0;
              }
              this_obj_02.tag = (int64_t)local_110.ptr;
              this_obj_02.u.float64 = in_stack_fffffffffffffe00.float64;
              val_03.tag._0_4_ = in_stack_fffffffffffffdf8;
              val_03.u = (JSValueUnion)in_stack_fffffffffffffdf0;
              val_03.tag._4_4_ = in_stack_fffffffffffffdfc;
              iVar5 = call_setter((JSContext *)
                                  CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                  in_stack_fffffffffffffde0,this_obj_02,val_03,iVar4);
              v_08.u._4_4_ = in_stack_fffffffffffffd8c;
              v_08.u.int32 = in_stack_fffffffffffffd88;
              v_08.tag._0_4_ = in_stack_fffffffffffffd90;
              v_08.tag._4_4_ = in_stack_fffffffffffffd94;
              JS_FreeValue((JSContext *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_08);
              v_09.u._4_4_ = in_stack_fffffffffffffd8c;
              v_09.u.int32 = in_stack_fffffffffffffd88;
              v_09.tag._0_4_ = in_stack_fffffffffffffd90;
              v_09.tag._4_4_ = in_stack_fffffffffffffd94;
              JS_FreeValue((JSContext *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_09);
              return iVar5;
            }
            v_10.u._4_4_ = in_stack_fffffffffffffd8c;
            v_10.u.int32 = in_stack_fffffffffffffd88;
            v_10.tag._0_4_ = in_stack_fffffffffffffd90;
            v_10.tag._4_4_ = in_stack_fffffffffffffd94;
            JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         v_10);
            if ((local_138[0] & 2) == 0) {
LAB_0012cb84:
              v_12.u._4_4_ = in_stack_fffffffffffffd8c;
              v_12.u.int32 = in_stack_fffffffffffffd88;
              v_12.tag._0_4_ = in_stack_fffffffffffffd90;
              v_12.tag._4_4_ = in_stack_fffffffffffffd94;
              JS_FreeValue((JSContext *)
                           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),v_12);
              iVar5 = JS_ThrowTypeErrorReadOnly
                                ((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                                 in_stack_fffffffffffffd84,in_stack_fffffffffffffd80);
              return iVar5;
            }
            if (local_e0.ptr == local_e8.ptr) {
              uVar13 = 3;
              uVar14 = 0;
              uVar15 = 0;
              uVar16 = 3;
              uVar17 = 0;
              this_obj_04.u._4_4_ = in_stack_ffffffffffffff9c;
              this_obj_04.u.int32 = in_stack_ffffffffffffff98;
              this_obj_04.tag = (int64_t)in_stack_ffffffffffffffa0.ptr;
              val_08.tag = (int64_t)in_stack_ffffffffffffff90;
              val_08.u.float64 = in_stack_ffffffffffffff88.float64;
              iVar5 = JS_DefineProperty(in_stack_ffffffffffffff80,this_obj_04,prop_01,val_08,
                                        (JSValue)in_stack_000000b0,(JSValue)in_stack_000000c0,
                                        in_stack_000000d0);
              v_11.u._4_4_ = in_stack_fffffffffffffdec;
              v_11.u.int32 = uVar15;
              v_11.tag._0_4_ = uVar16;
              v_11.tag._4_4_ = uVar17;
              JS_FreeValue((JSContext *)CONCAT44(uVar14,uVar13),v_11);
              return iVar5;
            }
            goto LAB_0012cbd3;
          }
        }
      }
    }
    else {
      BVar7 = __JS_AtomIsTaggedInt(local_d4);
      if (BVar7 == 0) {
        if (((0x14 < *(ushort *)((long)local_e8.ptr + 6)) &&
            (*(ushort *)((long)local_e8.ptr + 6) < 0x1e)) &&
           (iVar6 = JS_AtomIsNumericIndex
                              ((JSContext *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                               in_stack_fffffffffffffd94), iVar6 != 0)) {
          if (iVar6 < 0) {
            v_02.u._4_4_ = in_stack_fffffffffffffd8c;
            v_02.u.int32 = in_stack_fffffffffffffd88;
            v_02.tag._0_4_ = in_stack_fffffffffffffd90;
            v_02.tag._4_4_ = in_stack_fffffffffffffd94;
            JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         v_02);
            return -1;
          }
          goto LAB_0012c3aa;
        }
      }
      else {
        in_stack_fffffffffffffe8c = __JS_AtomToUInt32(local_d4);
        name = (JSAtom)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
        if (in_stack_fffffffffffffe8c < *(uint *)((long)local_e8.ptr + 0x40)) {
          if (local_e0.ptr == local_e8.ptr) {
            this_obj_00.tag._0_4_ = in_stack_fffffffffffffdf8;
            this_obj_00.u.ptr = in_stack_fffffffffffffdf0;
            this_obj_00.tag._4_4_ = in_stack_fffffffffffffdfc;
            prop_00.tag._0_4_ = in_stack_fffffffffffffde8;
            prop_00.u.ptr = in_stack_fffffffffffffde0;
            prop_00.tag._4_4_ = in_stack_fffffffffffffdec;
            val_06.tag = in_stack_fffffffffffffe18;
            val_06.u.float64 = in_stack_fffffffffffffe10.float64;
            iVar5 = JS_SetPropertyValue(in_stack_fffffffffffffdd8,this_obj_00,prop_00,val_06,
                                        in_stack_fffffffffffffdd4);
            return iVar5;
          }
          goto LAB_0012cbd3;
        }
        if ((0x14 < *(ushort *)((long)local_e8.ptr + 6)) &&
           (*(ushort *)((long)local_e8.ptr + 6) < 0x1e)) {
LAB_0012c3aa:
          val_00.u._4_4_ = in_stack_fffffffffffffd7c;
          val_00.u.int32 = in_stack_fffffffffffffd78;
          val_00.tag._0_4_ = in_stack_fffffffffffffd80;
          val_00.tag._4_4_ = in_stack_fffffffffffffd84;
          JVar12 = JS_ToNumberFree((JSContext *)0x12c3c7,val_00);
          local_198 = JVar12.u;
          local_190 = JVar12.tag;
          v_03.u._4_4_ = in_stack_fffffffffffffd8c;
          v_03.u.int32 = in_stack_fffffffffffffd88;
          v_03.tag._0_4_ = in_stack_fffffffffffffd90;
          v_03.tag._4_4_ = in_stack_fffffffffffffd94;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       v_03);
          v_21.tag = local_190;
          v_21.u.float64 = local_198.float64;
          iVar5 = JS_IsException(v_21);
          if (iVar5 != 0) {
            return -1;
          }
          iVar5 = JS_ThrowTypeErrorOrFalse
                            ((JSContext *)in_RDI.ptr,(int)(ulong)in_stack_00000008,
                             "out-of-bound numeric index");
          return iVar5;
        }
      }
    }
  }
  local_e8 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)local_e8.ptr + 0x18) + 0x38))->ptr;
  goto LAB_0012c921;
}

Assistant:

int JS_SetPropertyInternal(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    JSObject *p, *p1;
    JSShapeProperty *prs;
    JSProperty *pr;
    uint32_t tag;
    JSPropertyDescriptor desc;
    int ret;
#if 0
    printf("JS_SetPropertyInternal: "); print_atom(ctx, prop); printf("\n");
#endif
    tag = JS_VALUE_GET_TAG(this_obj);
    if (unlikely(tag != JS_TAG_OBJECT)) {
        switch(tag) {
        case JS_TAG_NULL:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of null", prop);
            return -1;
        case JS_TAG_UNDEFINED:
            JS_FreeValue(ctx, val);
            JS_ThrowTypeErrorAtom(ctx, "cannot set property '%s' of undefined", prop);
            return -1;
        default:
            /* even on a primitive type we can have setters on the prototype */
            p = NULL;
            p1 = JS_VALUE_GET_OBJ(JS_GetPrototypePrimitive(ctx, this_obj));
            goto prototype_lookup;
        }
    }
    p = JS_VALUE_GET_OBJ(this_obj);
retry:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        if (likely((prs->flags & (JS_PROP_TMASK | JS_PROP_WRITABLE |
                                  JS_PROP_LENGTH)) == JS_PROP_WRITABLE)) {
            /* fast case */
            set_value(ctx, &pr->u.value, val);
            return TRUE;
        } else if (prs->flags & JS_PROP_LENGTH) {
            assert(p->class_id == JS_CLASS_ARRAY);
            assert(prop == JS_ATOM_length);
            return set_array_length(ctx, p, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
            return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
            /* JS_PROP_WRITABLE is always true for variable
               references, but they are write protected in module name
               spaces. */
            if (p->class_id == JS_CLASS_MODULE_NS)
                goto read_only_prop;
            set_value(ctx, pr->u.var_ref->pvalue, val);
            return TRUE;
        } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry (potentially useless) */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs)) {
                JS_FreeValue(ctx, val);
                return -1;
            }
            goto retry;
        } else {
            goto read_only_prop;
        }
    }

    p1 = p;
    for(;;) {
        if (p1->is_exotic) {
            if (p1->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    uint32_t idx = __JS_AtomToUInt32(prop);
                    if (idx < p1->u.array.count) {
                        if (unlikely(p == p1))
                            return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), val, flags);
                        else
                            break;
                    } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                               p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                        goto typed_array_oob;
                    }
                } else if (p1->class_id >= JS_CLASS_UINT8C_ARRAY &&
                           p1->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_AtomIsNumericIndex(ctx, prop);
                    if (ret != 0) {
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return -1;
                        }
                    typed_array_oob:
                        val = JS_ToNumberFree(ctx, val);
                        JS_FreeValue(ctx, val);
                        if (JS_IsException(val))
                            return -1;
                        return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
                    }
                }
            } else {
                const JSClassExoticMethods *em = ctx->rt->class_array[p1->class_id].exotic;
                if (em) {
                    JSValue obj1;
                    if (em->set_property) {
                        /* set_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->set_property(ctx, obj1, prop,
                                               val, this_obj, flags);
                        JS_FreeValue(ctx, obj1);
                        JS_FreeValue(ctx, val);
                        return ret;
                    }
                    if (em->get_own_property) {
                        /* get_own_property can free the prototype */
                        obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
                        ret = em->get_own_property(ctx, &desc,
                                                   obj1, prop);
                        JS_FreeValue(ctx, obj1);
                        if (ret < 0) {
                            JS_FreeValue(ctx, val);
                            return ret;
                        }
                        if (ret) {
                            if (desc.flags & JS_PROP_GETSET) {
                                JSObject *setter;
                                if (JS_IsUndefined(desc.setter))
                                    setter = NULL;
                                else
                                    setter = JS_VALUE_GET_OBJ(desc.setter);
                                ret = call_setter(ctx, setter, this_obj, val, flags);
                                JS_FreeValue(ctx, desc.getter);
                                JS_FreeValue(ctx, desc.setter);
                                return ret;
                            } else {
                                JS_FreeValue(ctx, desc.value);
                                if (!(desc.flags & JS_PROP_WRITABLE))
                                    goto read_only_prop;
                                if (likely(p == p1)) {
                                    ret = JS_DefineProperty(ctx, this_obj, prop, val,
                                                            JS_UNDEFINED, JS_UNDEFINED,
                                                            JS_PROP_HAS_VALUE);
                                    JS_FreeValue(ctx, val);
                                    return ret;
                                } else {
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
        p1 = p1->shape->proto;
    prototype_lookup:
        if (!p1)
            break;

    retry2:
        prs = find_own_property(&pr, p1, prop);
        if (prs) {
            if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                return call_setter(ctx, pr->u.getset.setter, this_obj, val, flags);
            } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
                /* Instantiate property and retry (potentially useless) */
                if (JS_AutoInitProperty(ctx, p1, prop, pr, prs))
                    return -1;
                goto retry2;
            } else if (!(prs->flags & JS_PROP_WRITABLE)) {
            read_only_prop:
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, prop);
            }
        }
    }

    if (unlikely(flags & JS_PROP_NO_ADD)) {
        JS_FreeValue(ctx, val);
        JS_ThrowReferenceErrorNotDefined(ctx, prop);
        return -1;
    }

    if (unlikely(!p)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "not an object");
    }

    if (unlikely(!p->extensible)) {
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array &&
            __JS_AtomIsTaggedInt(prop)) {
            uint32_t idx = __JS_AtomToUInt32(prop);
            if (idx == p->u.array.count) {
                /* fast case */
                return add_fast_array_element(ctx, p, val, flags);
            } else {
                goto generic_create_prop;
            }
        } else {
        generic_create_prop:
            ret = JS_CreateProperty(ctx, p, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                                    flags |
                                    JS_PROP_HAS_VALUE |
                                    JS_PROP_HAS_ENUMERABLE |
                                    JS_PROP_HAS_WRITABLE |
                                    JS_PROP_HAS_CONFIGURABLE |
                                    JS_PROP_C_W_E);
            JS_FreeValue(ctx, val);
            return ret;
        }
    }

    pr = add_property(ctx, p, prop, JS_PROP_C_W_E);
    if (unlikely(!pr)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    pr->u.value = val;
    return TRUE;
}